

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::sse42::VirtualCurveIntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  bool bVar9;
  char cVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  undefined4 uVar14;
  ulong unaff_RBX;
  ulong uVar15;
  ulong uVar16;
  NodeRef *pNVar17;
  NodeRef *pNVar18;
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  ulong uVar22;
  vint4 bi_1;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar33;
  float fVar34;
  vint4 ai;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar35;
  undefined1 auVar32 [16];
  float fVar36;
  float fVar39;
  float fVar40;
  vint4 ai_3;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar41;
  float fVar42;
  float fVar45;
  float fVar46;
  vint4 ai_1;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar50 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar62;
  float fVar63;
  vint4 bi_3;
  undefined1 auVar60 [16];
  float fVar64;
  undefined1 auVar61 [16];
  float fVar65;
  float fVar69;
  float fVar70;
  vint4 bi;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar71;
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  NodeRef stack [244];
  
  stack[0] = root;
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar5 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar48 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar54 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar55 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar57 = fVar48 * 0.99999964;
  fVar58 = fVar54 * 0.99999964;
  fVar56 = fVar55 * 0.99999964;
  fVar48 = fVar48 * 1.0000004;
  fVar54 = fVar54 * 1.0000004;
  fVar55 = fVar55 * 1.0000004;
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar15 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar8 = (tray->tnear).field_0.i[k];
  auVar66._4_4_ = iVar8;
  auVar66._0_4_ = iVar8;
  auVar66._8_4_ = iVar8;
  auVar66._12_4_ = iVar8;
  iVar8 = (tray->tfar).field_0.i[k];
  auVar73._4_4_ = iVar8;
  auVar73._0_4_ = iVar8;
  auVar73._8_4_ = iVar8;
  auVar73._12_4_ = iVar8;
  pNVar18 = stack + 1;
  do {
    pNVar17 = pNVar18;
    if (pNVar17 == stack) break;
    pNVar18 = pNVar17 + -1;
    sVar20 = pNVar17[-1].ptr;
    do {
      if ((sVar20 & 0xf) == 0) {
        pfVar1 = (float *)(sVar20 + 0x20 + uVar21);
        auVar23._0_4_ = (*pfVar1 - fVar2) * fVar57;
        auVar23._4_4_ = (pfVar1[1] - fVar2) * fVar57;
        auVar23._8_4_ = (pfVar1[2] - fVar2) * fVar57;
        auVar23._12_4_ = (pfVar1[3] - fVar2) * fVar57;
        pfVar1 = (float *)(sVar20 + 0x20 + uVar22);
        auVar29._0_4_ = (*pfVar1 - fVar3) * fVar58;
        auVar29._4_4_ = (pfVar1[1] - fVar3) * fVar58;
        auVar29._8_4_ = (pfVar1[2] - fVar3) * fVar58;
        auVar29._12_4_ = (pfVar1[3] - fVar3) * fVar58;
        auVar24 = maxps(auVar23,auVar29);
        pfVar1 = (float *)(sVar20 + 0x20 + uVar15);
        auVar30._0_4_ = (*pfVar1 - fVar4) * fVar56;
        auVar30._4_4_ = (pfVar1[1] - fVar4) * fVar56;
        auVar30._8_4_ = (pfVar1[2] - fVar4) * fVar56;
        auVar30._12_4_ = (pfVar1[3] - fVar4) * fVar56;
        pfVar1 = (float *)(sVar20 + 0x20 + (uVar21 ^ 0x10));
        auVar37._0_4_ = (*pfVar1 - fVar2) * fVar48;
        auVar37._4_4_ = (pfVar1[1] - fVar2) * fVar48;
        auVar37._8_4_ = (pfVar1[2] - fVar2) * fVar48;
        auVar37._12_4_ = (pfVar1[3] - fVar2) * fVar48;
        pfVar1 = (float *)(sVar20 + 0x20 + (uVar22 ^ 0x10));
        auVar43._0_4_ = (*pfVar1 - fVar3) * fVar54;
        auVar43._4_4_ = (pfVar1[1] - fVar3) * fVar54;
        auVar43._8_4_ = (pfVar1[2] - fVar3) * fVar54;
        auVar43._12_4_ = (pfVar1[3] - fVar3) * fVar54;
        auVar38 = minps(auVar37,auVar43);
        pfVar1 = (float *)(sVar20 + 0x20 + (uVar15 ^ 0x10));
        auVar44._0_4_ = (*pfVar1 - fVar4) * fVar55;
        auVar44._4_4_ = (pfVar1[1] - fVar4) * fVar55;
        auVar44._8_4_ = (pfVar1[2] - fVar4) * fVar55;
        auVar44._12_4_ = (pfVar1[3] - fVar4) * fVar55;
        auVar31 = maxps(auVar30,auVar66);
        auVar24 = maxps(auVar24,auVar31);
        auVar31 = minps(auVar44,auVar73);
        auVar31 = minps(auVar38,auVar31);
        auVar25._4_4_ = -(uint)(auVar24._4_4_ <= auVar31._4_4_);
        auVar25._0_4_ = -(uint)(auVar24._0_4_ <= auVar31._0_4_);
        auVar25._8_4_ = -(uint)(auVar24._8_4_ <= auVar31._8_4_);
        auVar25._12_4_ = -(uint)(auVar24._12_4_ <= auVar31._12_4_);
        uVar14 = movmskps((int)unaff_RBX,auVar25);
LAB_0029f4ae:
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar14);
        bVar9 = true;
      }
      else {
        if ((int)(sVar20 & 0xf) == 2) {
          uVar19 = sVar20 & 0xfffffffffffffff0;
          auVar74._0_4_ = fVar6 * *(float *)(uVar19 + 0x70) + fVar7 * *(float *)(uVar19 + 0xa0);
          auVar74._4_4_ = fVar6 * *(float *)(uVar19 + 0x74) + fVar7 * *(float *)(uVar19 + 0xa4);
          auVar74._8_4_ = fVar6 * *(float *)(uVar19 + 0x78) + fVar7 * *(float *)(uVar19 + 0xa8);
          auVar74._12_4_ = fVar6 * *(float *)(uVar19 + 0x7c) + fVar7 * *(float *)(uVar19 + 0xac);
          auVar60._0_4_ =
               fVar5 * *(float *)(uVar19 + 0x20) +
               fVar6 * *(float *)(uVar19 + 0x50) + fVar7 * *(float *)(uVar19 + 0x80);
          auVar60._4_4_ =
               fVar5 * *(float *)(uVar19 + 0x24) +
               fVar6 * *(float *)(uVar19 + 0x54) + fVar7 * *(float *)(uVar19 + 0x84);
          auVar60._8_4_ =
               fVar5 * *(float *)(uVar19 + 0x28) +
               fVar6 * *(float *)(uVar19 + 0x58) + fVar7 * *(float *)(uVar19 + 0x88);
          auVar60._12_4_ =
               fVar5 * *(float *)(uVar19 + 0x2c) +
               fVar6 * *(float *)(uVar19 + 0x5c) + fVar7 * *(float *)(uVar19 + 0x8c);
          auVar67._0_4_ =
               fVar5 * *(float *)(uVar19 + 0x30) +
               fVar6 * *(float *)(uVar19 + 0x60) + fVar7 * *(float *)(uVar19 + 0x90);
          auVar67._4_4_ =
               fVar5 * *(float *)(uVar19 + 0x34) +
               fVar6 * *(float *)(uVar19 + 100) + fVar7 * *(float *)(uVar19 + 0x94);
          auVar67._8_4_ =
               fVar5 * *(float *)(uVar19 + 0x38) +
               fVar6 * *(float *)(uVar19 + 0x68) + fVar7 * *(float *)(uVar19 + 0x98);
          auVar67._12_4_ =
               fVar5 * *(float *)(uVar19 + 0x3c) +
               fVar6 * *(float *)(uVar19 + 0x6c) + fVar7 * *(float *)(uVar19 + 0x9c);
          fVar49 = (float)DAT_01ff1d40;
          fVar51 = DAT_01ff1d40._4_4_;
          fVar52 = DAT_01ff1d40._8_4_;
          fVar53 = DAT_01ff1d40._12_4_;
          auVar38._4_4_ = -(uint)(ABS(auVar60._4_4_) < fVar51);
          auVar38._0_4_ = -(uint)(ABS(auVar60._0_4_) < fVar49);
          auVar38._8_4_ = -(uint)(ABS(auVar60._8_4_) < fVar52);
          auVar38._12_4_ = -(uint)(ABS(auVar60._12_4_) < fVar53);
          auVar24 = blendvps(auVar60,_DAT_01ff1d40,auVar38);
          auVar75._4_4_ = -(uint)(ABS(auVar67._4_4_) < fVar51);
          auVar75._0_4_ = -(uint)(ABS(auVar67._0_4_) < fVar49);
          auVar75._8_4_ = -(uint)(ABS(auVar67._8_4_) < fVar52);
          auVar75._12_4_ = -(uint)(ABS(auVar67._12_4_) < fVar53);
          auVar31 = blendvps(auVar67,_DAT_01ff1d40,auVar75);
          auVar72._0_4_ = fVar5 * *(float *)(uVar19 + 0x40) + auVar74._0_4_;
          auVar72._4_4_ = fVar5 * *(float *)(uVar19 + 0x44) + auVar74._4_4_;
          auVar72._8_4_ = fVar5 * *(float *)(uVar19 + 0x48) + auVar74._8_4_;
          auVar72._12_4_ = fVar5 * *(float *)(uVar19 + 0x4c) + auVar74._12_4_;
          auVar26._4_4_ = -(uint)(ABS(auVar72._4_4_) < fVar51);
          auVar26._0_4_ = -(uint)(ABS(auVar72._0_4_) < fVar49);
          auVar26._8_4_ = -(uint)(ABS(auVar72._8_4_) < fVar52);
          auVar26._12_4_ = -(uint)(ABS(auVar72._12_4_) < fVar53);
          auVar38 = blendvps(auVar72,_DAT_01ff1d40,auVar26);
          auVar75 = rcpps(auVar74,auVar24);
          fVar49 = auVar75._0_4_;
          fVar51 = auVar75._4_4_;
          fVar52 = auVar75._8_4_;
          fVar53 = auVar75._12_4_;
          fVar49 = (1.0 - auVar24._0_4_ * fVar49) * fVar49 + fVar49;
          fVar51 = (1.0 - auVar24._4_4_ * fVar51) * fVar51 + fVar51;
          fVar52 = (1.0 - auVar24._8_4_ * fVar52) * fVar52 + fVar52;
          fVar53 = (1.0 - auVar24._12_4_ * fVar53) * fVar53 + fVar53;
          auVar24 = rcpps(auVar75,auVar31);
          fVar59 = auVar24._0_4_;
          fVar62 = auVar24._4_4_;
          fVar63 = auVar24._8_4_;
          fVar64 = auVar24._12_4_;
          fVar59 = (1.0 - auVar31._0_4_ * fVar59) * fVar59 + fVar59;
          fVar62 = (1.0 - auVar31._4_4_ * fVar62) * fVar62 + fVar62;
          fVar63 = (1.0 - auVar31._8_4_ * fVar63) * fVar63 + fVar63;
          fVar64 = (1.0 - auVar31._12_4_ * fVar64) * fVar64 + fVar64;
          auVar24 = rcpps(auVar24,auVar38);
          fVar65 = auVar24._0_4_;
          fVar69 = auVar24._4_4_;
          fVar70 = auVar24._8_4_;
          fVar71 = auVar24._12_4_;
          fVar65 = (1.0 - auVar38._0_4_ * fVar65) * fVar65 + fVar65;
          fVar69 = (1.0 - auVar38._4_4_ * fVar69) * fVar69 + fVar69;
          fVar70 = (1.0 - auVar38._8_4_ * fVar70) * fVar70 + fVar70;
          fVar71 = (1.0 - auVar38._12_4_ * fVar71) * fVar71 + fVar71;
          fVar42 = (*(float *)(uVar19 + 0x20) * fVar2 +
                   *(float *)(uVar19 + 0x50) * fVar3 +
                   *(float *)(uVar19 + 0x80) * fVar4 + *(float *)(uVar19 + 0xb0)) * -fVar49;
          fVar45 = (*(float *)(uVar19 + 0x24) * fVar2 +
                   *(float *)(uVar19 + 0x54) * fVar3 +
                   *(float *)(uVar19 + 0x84) * fVar4 + *(float *)(uVar19 + 0xb4)) * -fVar51;
          fVar46 = (*(float *)(uVar19 + 0x28) * fVar2 +
                   *(float *)(uVar19 + 0x58) * fVar3 +
                   *(float *)(uVar19 + 0x88) * fVar4 + *(float *)(uVar19 + 0xb8)) * -fVar52;
          fVar47 = (*(float *)(uVar19 + 0x2c) * fVar2 +
                   *(float *)(uVar19 + 0x5c) * fVar3 +
                   *(float *)(uVar19 + 0x8c) * fVar4 + *(float *)(uVar19 + 0xbc)) * -fVar53;
          fVar36 = (*(float *)(uVar19 + 0x30) * fVar2 +
                   *(float *)(uVar19 + 0x60) * fVar3 +
                   *(float *)(uVar19 + 0x90) * fVar4 + *(float *)(uVar19 + 0xc0)) * -fVar59;
          fVar39 = (*(float *)(uVar19 + 0x34) * fVar2 +
                   *(float *)(uVar19 + 100) * fVar3 +
                   *(float *)(uVar19 + 0x94) * fVar4 + *(float *)(uVar19 + 0xc4)) * -fVar62;
          fVar40 = (*(float *)(uVar19 + 0x38) * fVar2 +
                   *(float *)(uVar19 + 0x68) * fVar3 +
                   *(float *)(uVar19 + 0x98) * fVar4 + *(float *)(uVar19 + 200)) * -fVar63;
          fVar41 = (*(float *)(uVar19 + 0x3c) * fVar2 +
                   *(float *)(uVar19 + 0x6c) * fVar3 +
                   *(float *)(uVar19 + 0x9c) * fVar4 + *(float *)(uVar19 + 0xcc)) * -fVar64;
          fVar28 = (*(float *)(uVar19 + 0x40) * fVar2 +
                   *(float *)(uVar19 + 0x70) * fVar3 +
                   *(float *)(uVar19 + 0xa0) * fVar4 + *(float *)(uVar19 + 0xd0)) * -fVar65;
          fVar33 = (*(float *)(uVar19 + 0x44) * fVar2 +
                   *(float *)(uVar19 + 0x74) * fVar3 +
                   *(float *)(uVar19 + 0xa4) * fVar4 + *(float *)(uVar19 + 0xd4)) * -fVar69;
          fVar34 = (*(float *)(uVar19 + 0x48) * fVar2 +
                   *(float *)(uVar19 + 0x78) * fVar3 +
                   *(float *)(uVar19 + 0xa8) * fVar4 + *(float *)(uVar19 + 0xd8)) * -fVar70;
          fVar35 = (*(float *)(uVar19 + 0x4c) * fVar2 +
                   *(float *)(uVar19 + 0x7c) * fVar3 +
                   *(float *)(uVar19 + 0xac) * fVar4 + *(float *)(uVar19 + 0xdc)) * -fVar71;
          fVar49 = fVar49 + fVar42;
          fVar51 = fVar51 + fVar45;
          fVar52 = fVar52 + fVar46;
          fVar53 = fVar53 + fVar47;
          fVar59 = fVar59 + fVar36;
          fVar62 = fVar62 + fVar39;
          fVar63 = fVar63 + fVar40;
          fVar64 = fVar64 + fVar41;
          fVar65 = fVar65 + fVar28;
          fVar69 = fVar69 + fVar33;
          fVar70 = fVar70 + fVar34;
          fVar71 = fVar71 + fVar35;
          auVar50._0_4_ =
               (uint)((int)fVar59 < (int)fVar36) * (int)fVar59 |
               (uint)((int)fVar59 >= (int)fVar36) * (int)fVar36;
          auVar50._4_4_ =
               (uint)((int)fVar62 < (int)fVar39) * (int)fVar62 |
               (uint)((int)fVar62 >= (int)fVar39) * (int)fVar39;
          auVar50._8_4_ =
               (uint)((int)fVar63 < (int)fVar40) * (int)fVar63 |
               (uint)((int)fVar63 >= (int)fVar40) * (int)fVar40;
          auVar50._12_4_ =
               (uint)((int)fVar64 < (int)fVar41) * (int)fVar64 |
               (uint)((int)fVar64 >= (int)fVar41) * (int)fVar41;
          auVar24._4_4_ =
               (uint)((int)fVar69 < (int)fVar33) * (int)fVar69 |
               (uint)((int)fVar69 >= (int)fVar33) * (int)fVar33;
          auVar24._0_4_ =
               (uint)((int)fVar65 < (int)fVar28) * (int)fVar65 |
               (uint)((int)fVar65 >= (int)fVar28) * (int)fVar28;
          auVar24._8_4_ =
               (uint)((int)fVar70 < (int)fVar34) * (int)fVar70 |
               (uint)((int)fVar70 >= (int)fVar34) * (int)fVar34;
          auVar24._12_4_ =
               (uint)((int)fVar71 < (int)fVar35) * (int)fVar71 |
               (uint)((int)fVar71 >= (int)fVar35) * (int)fVar35;
          auVar38 = maxps(auVar50,auVar24);
          auVar27._0_4_ =
               (uint)((int)fVar49 < (int)fVar42) * (int)fVar42 |
               (uint)((int)fVar49 >= (int)fVar42) * (int)fVar49;
          auVar27._4_4_ =
               (uint)((int)fVar51 < (int)fVar45) * (int)fVar45 |
               (uint)((int)fVar51 >= (int)fVar45) * (int)fVar51;
          auVar27._8_4_ =
               (uint)((int)fVar52 < (int)fVar46) * (int)fVar46 |
               (uint)((int)fVar52 >= (int)fVar46) * (int)fVar52;
          auVar27._12_4_ =
               (uint)((int)fVar53 < (int)fVar47) * (int)fVar47 |
               (uint)((int)fVar53 >= (int)fVar47) * (int)fVar53;
          auVar61._0_4_ =
               (uint)((int)fVar59 < (int)fVar36) * (int)fVar36 |
               (uint)((int)fVar59 >= (int)fVar36) * (int)fVar59;
          auVar61._4_4_ =
               (uint)((int)fVar62 < (int)fVar39) * (int)fVar39 |
               (uint)((int)fVar62 >= (int)fVar39) * (int)fVar62;
          auVar61._8_4_ =
               (uint)((int)fVar63 < (int)fVar40) * (int)fVar40 |
               (uint)((int)fVar63 >= (int)fVar40) * (int)fVar63;
          auVar61._12_4_ =
               (uint)((int)fVar64 < (int)fVar41) * (int)fVar41 |
               (uint)((int)fVar64 >= (int)fVar41) * (int)fVar64;
          auVar68._0_4_ =
               (uint)((int)fVar65 < (int)fVar28) * (int)fVar28 |
               (uint)((int)fVar65 >= (int)fVar28) * (int)fVar65;
          auVar68._4_4_ =
               (uint)((int)fVar69 < (int)fVar33) * (int)fVar33 |
               (uint)((int)fVar69 >= (int)fVar33) * (int)fVar69;
          auVar68._8_4_ =
               (uint)((int)fVar70 < (int)fVar34) * (int)fVar34 |
               (uint)((int)fVar70 >= (int)fVar34) * (int)fVar70;
          auVar68._12_4_ =
               (uint)((int)fVar71 < (int)fVar35) * (int)fVar35 |
               (uint)((int)fVar71 >= (int)fVar35) * (int)fVar71;
          auVar75 = minps(auVar61,auVar68);
          auVar31._4_4_ =
               (uint)((int)fVar51 < (int)fVar45) * (int)fVar51 |
               (uint)((int)fVar51 >= (int)fVar45) * (int)fVar45;
          auVar31._0_4_ =
               (uint)((int)fVar49 < (int)fVar42) * (int)fVar49 |
               (uint)((int)fVar49 >= (int)fVar42) * (int)fVar42;
          auVar31._8_4_ =
               (uint)((int)fVar52 < (int)fVar46) * (int)fVar52 |
               (uint)((int)fVar52 >= (int)fVar46) * (int)fVar46;
          auVar31._12_4_ =
               (uint)((int)fVar53 < (int)fVar47) * (int)fVar53 |
               (uint)((int)fVar53 >= (int)fVar47) * (int)fVar47;
          auVar24 = maxps(auVar66,auVar31);
          auVar24 = maxps(auVar24,auVar38);
          auVar31 = minps(auVar73,auVar27);
          auVar31 = minps(auVar31,auVar75);
          auVar32._4_4_ = -(uint)(auVar24._4_4_ * 0.99999964 <= auVar31._4_4_ * 1.0000004);
          auVar32._0_4_ = -(uint)(auVar24._0_4_ * 0.99999964 <= auVar31._0_4_ * 1.0000004);
          auVar32._8_4_ = -(uint)(auVar24._8_4_ * 0.99999964 <= auVar31._8_4_ * 1.0000004);
          auVar32._12_4_ = -(uint)(auVar24._12_4_ * 0.99999964 <= auVar31._12_4_ * 1.0000004);
          uVar14 = movmskps((int)unaff_RBX,auVar32);
          goto LAB_0029f4ae;
        }
        bVar9 = false;
      }
      if (bVar9) {
        if (unaff_RBX == 0) {
          uVar12 = 4;
        }
        else {
          uVar19 = sVar20 & 0xfffffffffffffff0;
          lVar13 = 0;
          if (unaff_RBX != 0) {
            for (; (unaff_RBX >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
            }
          }
          uVar12 = 0;
          sVar20 = *(size_t *)(uVar19 + lVar13 * 8);
          uVar16 = unaff_RBX - 1 & unaff_RBX;
          if (uVar16 != 0) {
            pNVar18->ptr = sVar20;
            lVar13 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
              }
            }
            uVar11 = uVar16 - 1;
            while( true ) {
              pNVar18 = pNVar18 + 1;
              sVar20 = *(size_t *)(uVar19 + lVar13 * 8);
              uVar11 = uVar11 & uVar16;
              if (uVar11 == 0) break;
              pNVar18->ptr = sVar20;
              lVar13 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                }
              }
              uVar16 = uVar11 - 1;
            }
          }
        }
      }
      else {
        uVar12 = 6;
      }
    } while (uVar12 == 0);
    if (uVar12 == 6) {
      cVar10 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(sVar20 & 0xfffffffffffffff0) * 0x40 + 0x18))(pre,ray,k);
      uVar12 = 0;
      if (cVar10 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar12 = 1;
      }
    }
  } while ((uVar12 & 3) == 0);
  return pNVar17 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }